

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::SPxMainSM<double>::aggregateVars
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,SVectorBase<double> *row,int *i)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  SPxSense SVar5;
  pointer pdVar6;
  Nonzero<double> *pNVar7;
  pointer pdVar8;
  Tolerances *pTVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Item *pIVar10;
  DataKey *pDVar11;
  AggregationPS *this_01;
  undefined8 *puVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  uint uVar17;
  int *piVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R13;
  long in_FS_OFFSET;
  bool bVar19;
  double dVar20;
  Real RVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double new_lo_k;
  double new_up_k;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  double local_188;
  double local_170;
  undefined1 local_168 [12];
  undefined4 uStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double local_b0;
  ulong local_a8;
  value_type local_a0;
  undefined1 local_90 [24];
  undefined4 local_78;
  undefined4 uStack_74;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  long local_68;
  long local_60;
  shared_ptr<soplex::Tolerances> local_58;
  undefined1 local_48 [16];
  
  pdVar6 = (lp->super_LPColSetBase<double>).low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_c8 = (lp->super_LPRowSetBase<double>).right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[*i];
  uStack_c0 = 0;
  pNVar7 = row->m_elem;
  uVar17 = pNVar7->idx;
  uVar15 = (ulong)pNVar7[1].idx;
  stack0xfffffffffffffea0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_168._0_8_ = pNVar7->val;
  local_138 = pNVar7[1].val;
  uStack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dVar30 = pdVar6[(int)uVar17];
  pdVar8 = (lp->super_LPColSetBase<double>).up.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_118._8_8_ = 0;
  local_118._0_8_ = pdVar8[(int)uVar17];
  local_f8 = pdVar6[uVar15];
  uStack_f0 = 0;
  local_108 = pdVar8[uVar15];
  uStack_100 = 0;
  local_90._16_8_ = i;
  dVar20 = feastol(this);
  dVar23 = ABS(dVar30);
  if (ABS(dVar30) <= ABS((double)local_118._0_8_)) {
    dVar23 = ABS((double)local_118._0_8_);
  }
  if (dVar23 <= 1.0) {
    dVar23 = 1.0;
  }
  if (ABS((dVar30 - (double)local_118._0_8_) / dVar23) <= dVar20) {
    return OKAY;
  }
  dVar20 = feastol(this);
  dVar23 = ABS(local_f8);
  if (ABS(local_f8) <= ABS(local_108)) {
    dVar23 = ABS(local_108);
  }
  if (dVar23 <= 1.0) {
    dVar23 = 1.0;
  }
  if (ABS((local_f8 - local_108) / dVar23) <= dVar20) {
    return OKAY;
  }
  dVar23 = local_168._0_8_ * local_138;
  local_48._8_4_ = local_168._8_4_;
  local_48._0_8_ = dVar23;
  local_48._12_4_ = local_168._12_4_;
  if (0.0 <= dVar23) {
    if (dVar23 <= 0.0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_a0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"XMAISM12 This should never happen.","");
      *puVar12 = &PTR__SPxException_006a9ee8;
      puVar12[1] = puVar12 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar12 + 1),
                 local_a0.
                 super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(undefined1 *)
                         ((long)&(local_a0.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                         (long)local_a0.
                               super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr));
      *puVar12 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    ::soplex::infinity::__tls_init();
    local_188 = *(double *)(in_FS_OFFSET + -8);
    local_128._0_8_ = -local_188;
    local_128._8_8_ = 0x8000000000000000;
    if (local_f8 <= (double)local_128._0_8_) {
      local_158._8_8_ = 0x8000000000000000;
      local_158._0_8_ = local_128._0_8_;
      ::soplex::infinity::__tls_init();
      local_158._8_8_ = local_128._8_8_;
      local_158._0_8_ = local_128._0_8_;
    }
    else {
      local_158._8_4_ = (int)uStack_c0;
      local_158._0_8_ = (local_c8 - local_138 * local_f8) / (double)local_168._0_8_;
      local_158._12_4_ = (int)((ulong)uStack_c0 >> 0x20);
    }
    ::soplex::infinity::__tls_init();
    if (local_188 <= local_108) {
      local_148._8_8_ = 0;
      local_148._0_8_ = local_188;
      ::soplex::infinity::__tls_init();
      local_148._8_8_ = 0;
    }
    else {
      local_148._8_4_ = (int)uStack_c0;
      local_148._0_8_ = (local_c8 - local_138 * local_108) / (double)local_168._0_8_;
      local_148._12_4_ = (int)((ulong)uStack_c0 >> 0x20);
    }
    ::soplex::infinity::__tls_init();
    if (dVar30 <= (double)local_128._0_8_) {
      ::soplex::infinity::__tls_init();
      local_170 = (double)local_128._0_8_;
    }
    else {
      local_170 = (local_c8 - (double)local_168._0_8_ * dVar30) / local_138;
    }
    ::soplex::infinity::__tls_init();
    if (local_188 <= local_118._0_8_) goto LAB_001f650d;
    uVar26 = local_118._0_4_;
    uVar27 = local_118._4_4_;
LAB_001f64ee:
    local_188 = (local_c8 - (double)local_168._0_8_ * (double)CONCAT44(uVar27,uVar26)) / local_138;
  }
  else {
    ::soplex::infinity::__tls_init();
    local_188 = *(double *)(in_FS_OFFSET + -8);
    if (local_188 <= local_108) {
      ::soplex::infinity::__tls_init();
      local_158._8_8_ = 0x8000000000000000;
      local_158._0_8_ = -local_188;
    }
    else {
      local_158._8_4_ = (int)uStack_c0;
      local_158._0_8_ = (local_c8 - local_138 * local_108) / (double)local_168._0_8_;
      local_158._12_4_ = (int)((ulong)uStack_c0 >> 0x20);
    }
    ::soplex::infinity::__tls_init();
    local_128._0_8_ = -local_188;
    local_128._8_8_ = 0x8000000000000000;
    if (local_f8 <= (double)local_128._0_8_) {
      local_148._8_8_ = 0;
      local_148._0_8_ = local_188;
      ::soplex::infinity::__tls_init();
      local_148._8_8_ = 0;
    }
    else {
      local_148._8_4_ = (int)uStack_c0;
      local_148._0_8_ = (local_c8 - local_138 * local_f8) / (double)local_168._0_8_;
      local_148._12_4_ = (int)((ulong)uStack_c0 >> 0x20);
    }
    ::soplex::infinity::__tls_init();
    if (local_188 <= (double)local_118._0_8_) {
      ::soplex::infinity::__tls_init();
      local_170 = (double)local_128._0_8_;
    }
    else {
      local_170 = (local_c8 - (double)local_168._0_8_ * (double)local_118._0_8_) / local_138;
    }
    ::soplex::infinity::__tls_init();
    uVar26 = SUB84(dVar30,0);
    uVar27 = (undefined4)((ulong)dVar30 >> 0x20);
    if ((double)local_128._0_8_ < dVar30) goto LAB_001f64ee;
LAB_001f650d:
    ::soplex::infinity::__tls_init();
  }
  local_e0 = local_188;
  ::soplex::infinity::__tls_init();
  dVar23 = *(double *)(in_FS_OFFSET + -8);
  dVar20 = (double)((ulong)DAT_00601010 ^ (ulong)dVar23);
  local_128._8_4_ = DAT_00601010._8_4_;
  local_128._0_8_ = dVar20;
  local_128._12_4_ = DAT_00601010._12_4_;
  local_a8 = uVar15;
  if (dVar20 < (double)local_158._0_8_) {
LAB_001f6587:
    local_d8 = local_170;
    ::soplex::infinity::__tls_init();
    if ((double)local_128._0_8_ < local_d8) {
LAB_001f65f0:
      pTVar9 = (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_02 = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_02->_M_use_count = this_02->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_02->_M_use_count = this_02->_M_use_count + 1;
        }
      }
      local_d8 = Tolerances::epsilon(pTVar9);
      uVar26 = local_158._12_4_;
      dVar20 = local_158._0_8_ - dVar30;
      local_158._8_4_ = local_158._8_4_;
      local_158._0_8_ = dVar20;
      local_158._12_4_ = uVar26;
      if (dVar20 < local_d8) {
        pTVar9 = (this->super_SPxSimplifier<double>)._tolerances.
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        unaff_R13 = (this->super_SPxSimplifier<double>)._tolerances.
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
        if (unaff_R13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            unaff_R13->_M_use_count = unaff_R13->_M_use_count + 1;
            UNLOCK();
          }
          else {
            unaff_R13->_M_use_count = unaff_R13->_M_use_count + 1;
          }
        }
        RVar21 = Tolerances::epsilon(pTVar9);
        bVar19 = -RVar21 < (double)local_148._0_8_ - (double)local_118._0_8_;
      }
      else {
        bVar19 = false;
      }
      if (unaff_R13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
          (double)local_158._0_8_ < local_d8) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R13);
      }
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      local_158._0_8_ = local_170;
      local_158._0_8_ = local_170;
      pTVar9 = (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (bVar19) {
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        RVar21 = Tolerances::epsilon(pTVar9);
        local_158._0_8_ = (double)local_158._0_8_ - local_f8;
        local_148._0_8_ = RVar21;
        if ((double)local_158._0_8_ < RVar21) {
          local_d8 = local_e0;
          pTVar9 = (this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_02 = (this->super_SPxSimplifier<double>)._tolerances.
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_02->_M_use_count = this_02->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_02->_M_use_count = this_02->_M_use_count + 1;
            }
          }
          RVar21 = Tolerances::epsilon(pTVar9);
          bVar19 = -RVar21 < local_d8 - local_108;
        }
        else {
          bVar19 = false;
        }
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
            (double)local_158._0_8_ < (double)local_148._0_8_) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (!bVar19) goto LAB_001f68f0;
      }
      else {
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        RVar21 = Tolerances::epsilon(pTVar9);
        local_158._0_8_ = (double)local_158._0_8_ - local_f8;
        local_148._0_8_ = RVar21;
        if ((double)local_158._0_8_ < RVar21) {
          local_d8 = local_e0;
          pTVar9 = (this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_02 = (this->super_SPxSimplifier<double>)._tolerances.
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_02->_M_use_count = this_02->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_02->_M_use_count = this_02->_M_use_count + 1;
            }
          }
          RVar21 = Tolerances::epsilon(pTVar9);
          bVar19 = -RVar21 < local_d8 - local_108;
        }
        else {
          bVar19 = false;
        }
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
            (double)local_158._0_8_ < (double)local_148._0_8_) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (bVar19) goto LAB_001f68be;
      }
      if (ABS((double)local_168._0_8_) <= ABS(local_138)) goto LAB_001f68be;
    }
    else {
      local_d8 = local_e0;
      ::soplex::infinity::__tls_init();
      if (local_d8 < dVar23) goto LAB_001f65f0;
    }
LAB_001f68f0:
    uVar14 = (uint)local_a8;
    local_a8 = (ulong)uVar17;
    local_b0 = local_108;
    local_b8 = local_f8;
    local_108 = (double)local_118._0_8_;
    uStack_100 = local_118._8_8_;
    uStack_f0 = 0;
    uVar26 = local_168._0_4_;
    uVar27 = local_168._4_4_;
    uVar28 = local_168._8_4_;
    uVar29 = uStack_15c;
    _Stack_70._M_pi = uStack_130;
    uVar17 = uVar14;
    local_f8 = dVar30;
  }
  else {
    ::soplex::infinity::__tls_init();
    if ((double)local_148._0_8_ < dVar23) goto LAB_001f6587;
LAB_001f68be:
    local_b0 = (double)local_118._0_8_;
    uVar26 = (undefined4)local_138;
    uVar27 = local_138._4_4_;
    uVar28 = (undefined4)uStack_130;
    uVar29 = uStack_130._4_4_;
    local_138 = (double)local_168._0_8_;
    _Stack_70._M_pi = stack0xfffffffffffffea0;
    local_b8 = dVar30;
  }
  pIVar10 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  pDVar11 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey;
  local_60 = (long)(int)local_a8;
  iVar3 = pDVar11[local_60].idx;
  local_158._0_4_ = uVar17;
  local_68 = (long)(int)uVar17;
  local_78 = SUB84(local_138,0);
  uStack_74 = (undefined4)((ulong)local_138 >> 0x20);
  local_148._8_8_ = (ulong)_Stack_70._M_pi ^ 0x8000000000000000;
  local_148._0_8_ = -local_138 / (double)CONCAT44(uVar27,uVar26);
  local_138 = (double)CONCAT44(uVar27,uVar26);
  uStack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar29,uVar28);
  local_d8 = local_c8 / (double)CONCAT44(uVar27,uVar26);
  uStack_d0 = uStack_c0;
  if (0 < pIVar10[iVar3].data.super_SVectorBase<double>.memused) {
    iVar4 = pDVar11[local_68].idx;
    lVar16 = 0;
    do {
      pNVar7 = pIVar10[iVar3].data.super_SVectorBase<double>.m_elem;
      uVar17 = pNVar7[lVar16].idx;
      if (uVar17 != *(uint *)local_90._16_8_) {
        dVar30 = pNVar7[lVar16].val;
        local_118._0_8_ =
             (lp->super_LPRowSetBase<double>).right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[(int)uVar17];
        local_168._0_8_ =
             (lp->super_LPRowSetBase<double>).left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[(int)uVar17];
        ::soplex::infinity::__tls_init();
        dVar20 = local_d8 * dVar30;
        auVar33._8_4_ = (int)uStack_d0;
        auVar33._0_8_ = dVar20;
        auVar33._12_4_ = (int)((ulong)uStack_d0 >> 0x20);
        if ((double)local_128._0_8_ < (double)local_168._0_8_) {
          local_a0.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)((double)local_168._0_8_ - dVar20);
          _local_168 = auVar33;
          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
                    (lp,(ulong)uVar17,&local_a0);
          piVar18 = &(this->super_SPxSimplifier<double>).m_chgLRhs;
          *piVar18 = *piVar18 + 1;
          auVar33 = _local_168;
        }
        _local_168 = auVar33;
        ::soplex::infinity::__tls_init();
        if ((double)local_118._0_8_ < dVar23) {
          local_a0.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)((double)local_118._0_8_ - (double)local_168._0_8_);
          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
                    (lp,(ulong)uVar17,&local_a0);
          piVar18 = &(this->super_SPxSimplifier<double>).m_chgLRhs;
          *piVar18 = *piVar18 + 1;
        }
        local_a0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(dVar30 * (double)local_148._0_8_);
        pNVar7 = pIVar10[iVar4].data.super_SVectorBase<double>.m_elem;
        if ((pNVar7 == (Nonzero<double> *)0x0) ||
           (uVar15 = (ulong)pIVar10[iVar4].data.super_SVectorBase<double>.memused, (long)uVar15 < 1)
           ) {
LAB_001f6b3c:
          uVar14 = 0xffffffff;
        }
        else {
          if (pNVar7->idx == uVar17) {
            bVar19 = true;
            uVar13 = 0;
          }
          else {
            uVar13 = 0;
            piVar18 = &pNVar7[1].idx;
            do {
              if (uVar15 - 1 == uVar13) goto LAB_001f6b3c;
              uVar13 = uVar13 + 1;
              uVar14 = *piVar18;
              piVar18 = piVar18 + 4;
            } while (uVar14 != uVar17);
            bVar19 = uVar13 < uVar15;
          }
          uVar14 = (uint)uVar13;
          if (!bVar19) goto LAB_001f6b3c;
        }
        if (-1 < (int)uVar14) {
          local_a0.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 ((double)local_a0.
                          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + pNVar7[uVar14].val);
          piVar18 = &(this->super_SPxSimplifier<double>).m_remNzos;
          *piVar18 = *piVar18 + 1;
        }
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                  (lp,(ulong)uVar17,(ulong)(uint)local_158._0_4_,&local_a0,0);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pIVar10[iVar3].data.super_SVectorBase<double>.memused);
  }
  dVar30 = (lp->super_LPColSetBase<double>).object.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[local_60];
  SVar5 = lp->thesense;
  dVar20 = epsZero(this);
  uVar26 = local_158._0_4_;
  if (dVar20 < ABS(dVar30)) {
    if (SVar5 == MINIMIZE) {
      dVar30 = -dVar30;
    }
    (*(this->super_SPxSimplifier<double>)._vptr_SPxSimplifier[0x11])(local_d8 * dVar30,this);
    dVar20 = (lp->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[local_68];
    if (lp->thesense == MINIMIZE) {
      dVar20 = -dVar20;
    }
    local_a0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)((double)local_148._0_8_ * dVar30 + dVar20);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x24])
              (lp,(ulong)(uint)uVar26,&local_a0,0);
  }
  dVar30 = ABS(local_c8);
  auVar32._8_8_ = local_138 * local_108;
  auVar32._0_8_ = local_c8;
  dVar22 = ABS(local_138 * local_108);
  dVar20 = dVar30;
  if (dVar30 <= dVar22) {
    dVar20 = dVar22;
  }
  auVar31._8_8_ = local_138 * local_f8;
  auVar31._0_8_ = local_c8;
  dVar22 = ABS(local_138 * local_f8);
  if (dVar30 <= dVar22) {
    dVar30 = dVar22;
  }
  local_168._0_8_ = 1.0;
  if (1.0 <= dVar20) {
    local_168._0_8_ = dVar20;
  }
  local_148._0_8_ = 1.0;
  if (1.0 <= dVar30) {
    local_148._0_8_ = dVar30;
  }
  stack0xfffffffffffffea0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auVar24._8_8_ = local_168._0_8_;
  auVar24._0_8_ = local_168._0_8_;
  auVar33 = divpd(auVar32,auVar24);
  local_118._8_8_ = auVar33._8_8_;
  local_118._0_8_ = auVar33._0_8_ - (double)local_118._8_8_;
  local_148._8_8_ = 0;
  auVar25._8_8_ = local_148._0_8_;
  auVar25._0_8_ = local_148._0_8_;
  auVar33 = divpd(auVar31,auVar25);
  dVar30 = auVar33._0_8_ - auVar33._8_8_;
  dVar20 = epsZero(this);
  uVar15 = ~(ulong)ABS((double)local_118._8_8_) & local_118._8_8_;
  local_118._8_4_ = (int)uVar15;
  local_118._0_8_ = ~-(ulong)(ABS((double)local_118._0_8_) <= dVar20) & local_118._0_8_;
  local_118._12_4_ = (int)(uVar15 >> 0x20);
  dVar20 = epsZero(this);
  uVar15 = local_a8;
  dVar30 = (double)(~-(ulong)(ABS(dVar30) <= dVar20) & (ulong)dVar30);
  if ((double)local_48._0_8_ <= 0.0) {
    if (0.0 <= (double)local_48._0_8_) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_a0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"XMAISM12 This should never happen.","");
      *puVar12 = &PTR__SPxException_006a9ee8;
      puVar12[1] = puVar12 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar12 + 1),
                 local_a0.
                 super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(undefined1 *)
                         ((long)&(local_a0.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                         (long)local_a0.
                               super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr));
      *puVar12 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    ::soplex::infinity::__tls_init();
    if (local_f8 <= (double)local_128._0_8_) {
      ::soplex::infinity::__tls_init();
      local_170 = (double)local_128._0_8_;
    }
    else {
      local_170 = ((double)local_148._0_8_ * dVar30) / (double)CONCAT44(uStack_74,local_78);
    }
    ::soplex::infinity::__tls_init();
    if (local_108 < dVar23) {
      dVar23 = ((double)local_168._0_8_ * (double)local_118._0_8_) /
               (double)CONCAT44(uStack_74,local_78);
      goto LAB_001f6ee7;
    }
  }
  else {
    ::soplex::infinity::__tls_init();
    if (dVar23 <= local_108) {
      ::soplex::infinity::__tls_init();
      local_170 = (double)local_128._0_8_;
    }
    else {
      local_170 = ((double)local_168._0_8_ * (double)local_118._0_8_) /
                  (double)CONCAT44(uStack_74,local_78);
    }
    ::soplex::infinity::__tls_init();
    if ((double)local_128._0_8_ < local_f8) {
      dVar23 = ((double)local_148._0_8_ * dVar30) / (double)CONCAT44(uStack_74,local_78);
      goto LAB_001f6ee7;
    }
  }
  ::soplex::infinity::__tls_init();
LAB_001f6ee7:
  dVar30 = local_170;
  local_e0 = dVar23;
  dVar23 = epsZero(this);
  if (dVar23 < dVar30 - local_b8) {
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
              (lp,(ulong)(uint)uVar26,&local_170,0);
    piVar18 = &(this->super_SPxSimplifier<double>).m_chgBnds;
    *piVar18 = *piVar18 + 1;
  }
  dVar30 = local_e0;
  dVar23 = epsZero(this);
  if (dVar30 - local_b0 < -dVar23) {
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d])
              (lp,(ulong)(uint)uVar26,&local_e0,0);
    piVar18 = &(this->super_SPxSimplifier<double>).m_chgBnds;
    *piVar18 = *piVar18 + 1;
  }
  this_01 = (AggregationPS *)operator_new(0xa8);
  uVar17 = *(uint *)local_90._16_8_;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_SPxSimplifier<double>)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->super_SPxSimplifier<double>)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  AggregationPS::AggregationPS(this_01,lp,uVar17,(int)uVar15,local_c8,local_b0,local_b8,&local_58);
  local_a0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<double>::AggregationPS*>
            (&local_a0.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_01);
  if (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&local_a0);
  piVar18 = (this->m_rIdx).data;
  piVar18[(int)*(uint *)local_90._16_8_] =
       piVar18[(long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xf])(lp);
  piVar18 = (this->m_cIdx).data;
  piVar18[local_60] =
       piVar18[(long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x15])(lp,uVar15 & 0xffffffff);
  uVar1 = (this->super_SPxSimplifier<double>).m_remRows;
  uVar2 = (this->super_SPxSimplifier<double>).m_remCols;
  (this->super_SPxSimplifier<double>).m_remRows = uVar1 + 1;
  (this->super_SPxSimplifier<double>).m_remCols = uVar2 + 1;
  piVar18 = &(this->super_SPxSimplifier<double>).m_remNzos;
  *piVar18 = *piVar18 + 2;
  piVar18 = (this->m_stat).data + 0xf;
  *piVar18 = *piVar18 + 1;
  if (local_a0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.
               super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}